

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstrmatrixflowtbb.cpp
# Opt level: O2

void __thiscall
TPZStructMatrixTBBFlow<std::complex<double>_>::Assemble
          (TPZStructMatrixTBBFlow<std::complex<double>_> *this,TPZBaseMatrix *stiffness,
          TPZBaseMatrix *rhs,TPZAutoPointer<TPZGuiInterface> *guiInterface)

{
  int64_t newRows;
  long lVar1;
  TPZAutoPointer<TPZGuiInterface> local_d0;
  TPZAutoPointer<TPZGuiInterface> local_c8;
  TPZFMatrix<std::complex<double>_> rhsloc;
  
  lVar1 = __dynamic_cast(this,&TPZStructMatrixTBBFlow<std::complex<double>>::typeinfo,
                         &::TPZStructMatrix::typeinfo,0xfffffffffffffffe);
  RunStatsTable::start(&ass_stiff);
  if (*(char *)(lVar1 + 0x58) == '\x01') {
    newRows = *(int64_t *)(lVar1 + 0x70);
    TPZFMatrix<std::complex<double>_>::TPZFMatrix(&rhsloc);
    if (*(char *)((long)&(this->fFlowGraph).fRef + *(long *)(*(long *)this + -0x60) + 4) == '\x01')
    {
      TPZFMatrix<std::complex<double>_>::Redim(&rhsloc,newRows,rhs->fCol);
    }
    local_c8 = (TPZAutoPointer<TPZGuiInterface>)guiInterface->fRef;
    LOCK();
    ((local_c8.fRef)->fCounter).super___atomic_base<int>._M_i =
         ((local_c8.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    (**(code **)(*(long *)this + 0x68))(this,stiffness,&rhsloc);
    TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer(&local_c8);
    if (*(char *)((long)&(this->fFlowGraph).fRef + *(long *)(*(long *)this + -0x60) + 4) == '\x01')
    {
      TPZEquationFilter::Scatter((TPZEquationFilter *)(lVar1 + 0x48),(TPZBaseMatrix *)&rhsloc,rhs);
    }
    TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&rhsloc);
  }
  else {
    local_d0 = (TPZAutoPointer<TPZGuiInterface>)guiInterface->fRef;
    LOCK();
    ((local_d0.fRef)->fCounter).super___atomic_base<int>._M_i =
         ((local_d0.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    (**(code **)(*(long *)this + 0x68))(this,stiffness,rhs);
    TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer(&local_d0);
  }
  RunStatsTable::stop(&ass_stiff);
  return;
}

Assistant:

void TPZStructMatrixTBBFlow<TVar>::Assemble(TPZBaseMatrix & stiffness, TPZBaseMatrix & rhs,TPZAutoPointer<TPZGuiInterface> guiInterface){
    const auto &equationFilter =
        (dynamic_cast<TPZStructMatrix*>(this))->EquationFilter();
    ass_stiff.start();
    if (equationFilter.IsActive()) {
        int64_t neqcondense = equationFilter.NActiveEquations();
#ifdef PZDEBUG
        if (stiffness.Rows() != neqcondense) {
            DebugStop();
        }
#endif
        TPZFMatrix<TVar> rhsloc;
        if(ComputeRhs()) rhsloc.Redim(neqcondense, rhs.Cols());
        this->MultiThread_Assemble(stiffness,rhsloc,guiInterface);
        if(ComputeRhs()) equationFilter.Scatter(rhsloc, rhs);
    }
    else
    {
        this->MultiThread_Assemble(stiffness,rhs,guiInterface);
        
    }
    ass_stiff.stop();
}